

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int decode(uint64_t *in,uint8_t *out,size_t l,uint64_t q)

{
  bool bVar1;
  uint8_t val;
  size_t bi;
  size_t by;
  size_t num_bytes;
  uint64_t t2;
  uint64_t t1;
  uint64_t q_local;
  size_t l_local;
  uint8_t *out_local;
  uint64_t *in_local;
  int local_4;
  
  if ((in == (uint64_t *)0x0) || (out == (uint8_t *)0x0)) {
    local_4 = -1;
  }
  else {
    num_bytes = l >> 3;
    if (num_bytes << 3 != l) {
      num_bytes = num_bytes + 1;
    }
    l_local = l;
    for (by = 0; by < num_bytes; by = by + 1) {
      out[by] = '\0';
      for (bi = 0; bi < 8 && l_local != 0; bi = bi + 1) {
        bVar1 = true;
        if (q >> 2 <= in[by * 8 + bi]) {
          bVar1 = q - (q >> 2) < in[by * 8 + bi];
        }
        out[by] = out[by] | !bVar1 << (7U - (char)bi & 0x1f);
        l_local = l_local - 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int decode(uint64_t in[], uint8_t out[], size_t l, uint64_t q) {
    if(in == NULL || out == NULL)
        return -1;

    // define thresholds
    uint64_t t1 = q/4;
    uint64_t t2 = q - q/4;

    // compute number of bytes
    size_t num_bytes = l/8;
    if(num_bytes * 8 != l)
        num_bytes++;

    // iterate over bytes and bits and decode input
    for(size_t by = 0; by < num_bytes; by++) {
        out[by] = 0;
        for(size_t bi = 0; bi < 8 && l > 0; bi++) {
            uint8_t val = (in[by*8+bi] < t1 || in[by*8+bi] > t2) ? 0 : 1;
            out[by] |= val << (7-bi);
            l--;
        }
    }

    return 0;
}